

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

BOOL __thiscall
Js::SmallSpanSequence::GetRangeAt
          (SmallSpanSequence *this,int index,SmallSpanSequenceIter *iter,int *pCountOfMissed,
          StatementData *data)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  TValue TVar4;
  undefined4 *puVar5;
  int local_38;
  SmallSpan local_34;
  int countOfMissed;
  SmallSpan span;
  StatementData *data_local;
  int *pCountOfMissed_local;
  SmallSpanSequenceIter *iter_local;
  int index_local;
  SmallSpanSequence *this_local;
  
  _countOfMissed = data;
  uVar3 = JsUtil::GrowingArray<unsigned_int,_Memory::HeapAllocator>::Count(this->pStatementBuffer);
  if (uVar3 <= (uint)index) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x154f,"((uint32)index < pStatementBuffer->Count())",
                                "(uint32)index < pStatementBuffer->Count()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  TVar4 = JsUtil::GrowingArray<unsigned_int,_Memory::HeapAllocator>::ItemInBuffer
                    (this->pStatementBuffer,index);
  SmallSpan::SmallSpan(&local_34,TVar4);
  local_38 = 0;
  if (local_34.sourceBegin == 0x7fff) {
    if (this->pActualOffsetList == (GrowingUint32HeapArray *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x1558,"(this->pActualOffsetList)","this->pActualOffsetList");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    uVar3 = JsUtil::GrowingArray<unsigned_int,_Memory::HeapAllocator>::Count
                      (this->pActualOffsetList);
    if (uVar3 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x1559,"(this->pActualOffsetList->Count() > 0)",
                                  "this->pActualOffsetList->Count() > 0");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    uVar3 = JsUtil::GrowingArray<unsigned_int,_Memory::HeapAllocator>::Count
                      (this->pActualOffsetList);
    if (uVar3 <= (uint)iter->indexOfActualOffset) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x155a,
                                  "(this->pActualOffsetList->Count() > (uint32)iter.indexOfActualOffset)"
                                  ,
                                  "this->pActualOffsetList->Count() > (uint32)iter.indexOfActualOffset"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    TVar4 = JsUtil::GrowingArray<unsigned_int,_Memory::HeapAllocator>::ItemInBuffer
                      (this->pActualOffsetList,iter->indexOfActualOffset);
    _countOfMissed->sourceBegin = TVar4;
    local_38 = 1;
  }
  else {
    _countOfMissed->sourceBegin = iter->accumulatedSourceBegin + (int)(short)local_34.sourceBegin;
  }
  if (local_34.bytecodeBegin == 0x7fff) {
    if (this->pActualOffsetList == (GrowingUint32HeapArray *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x1567,"(this->pActualOffsetList)","this->pActualOffsetList");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    uVar3 = JsUtil::GrowingArray<unsigned_int,_Memory::HeapAllocator>::Count
                      (this->pActualOffsetList);
    if (uVar3 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x1568,"(this->pActualOffsetList->Count() > 0)",
                                  "this->pActualOffsetList->Count() > 0");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    uVar3 = JsUtil::GrowingArray<unsigned_int,_Memory::HeapAllocator>::Count
                      (this->pActualOffsetList);
    if (uVar3 <= (uint)(iter->indexOfActualOffset + local_38)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x1569,
                                  "(this->pActualOffsetList->Count() > (uint32)(iter.indexOfActualOffset + countOfMissed))"
                                  ,
                                  "this->pActualOffsetList->Count() > (uint32)(iter.indexOfActualOffset + countOfMissed)"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    TVar4 = JsUtil::GrowingArray<unsigned_int,_Memory::HeapAllocator>::ItemInBuffer
                      (this->pActualOffsetList,iter->indexOfActualOffset + local_38);
    _countOfMissed->bytecodeBegin = TVar4;
    local_38 = local_38 + 1;
  }
  else {
    _countOfMissed->bytecodeBegin = iter->accumulatedBytecodeBegin + (uint)local_34.bytecodeBegin;
  }
  if (pCountOfMissed != (int *)0x0) {
    *pCountOfMissed = local_38;
  }
  return 1;
}

Assistant:

BOOL SmallSpanSequence::GetRangeAt(int index, SmallSpanSequenceIter &iter, int * pCountOfMissed, StatementData & data)
    {
        Assert((uint32)index < pStatementBuffer->Count());

        SmallSpan span(pStatementBuffer->ItemInBuffer((uint32)index));

        int countOfMissed = 0;

        if ((short)span.sourceBegin == SHRT_MAX)
        {
            // Look in ActualOffset store
            Assert(this->pActualOffsetList);
            Assert(this->pActualOffsetList->Count() > 0);
            Assert(this->pActualOffsetList->Count() > (uint32)iter.indexOfActualOffset);

            data.sourceBegin = this->pActualOffsetList->ItemInBuffer((uint32)iter.indexOfActualOffset);
            countOfMissed++;
        }
        else
        {
            data.sourceBegin = iter.accumulatedSourceBegin + (short)span.sourceBegin;
        }

        if (span.bytecodeBegin == SHRT_MAX)
        {
            // Look in ActualOffset store
            Assert(this->pActualOffsetList);
            Assert(this->pActualOffsetList->Count() > 0);
            Assert(this->pActualOffsetList->Count() > (uint32)(iter.indexOfActualOffset + countOfMissed));

            data.bytecodeBegin = this->pActualOffsetList->ItemInBuffer((uint32)iter.indexOfActualOffset + countOfMissed);
            countOfMissed++;
        }
        else
        {
            data.bytecodeBegin = iter.accumulatedBytecodeBegin + span.bytecodeBegin;
        }

        if (pCountOfMissed)
        {
            *pCountOfMissed = countOfMissed;
        }

        return TRUE;
    }